

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKeySequenceRevealerFilter.cpp
# Opt level: O3

bool __thiscall
QKeySequenceRevealerFilter::eventFilter
          (QKeySequenceRevealerFilter *this,QObject *object,QEvent *event)

{
  char16_t *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  undefined1 auVar6 [8];
  long lVar7;
  QHelpEvent *he;
  QKeySequence sequence;
  QKeySequence shortcut;
  optional<std::pair<QWidget_*,_QKeySequence>_> ws;
  undefined1 local_128 [8];
  char16_t *pcStack_120;
  qsizetype local_118;
  QArrayDataPointer<char16_t> local_110;
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [8];
  char16_t *local_e8;
  qsizetype qStack_e0;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  bool local_c0;
  QWidget *local_b8;
  QArrayDataPointer<char16_t> local_b0;
  char local_98;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  if ((*(ushort *)(event + 8) & 0xfffe) != 0x6e) goto LAB_001864e9;
  local_c0 = false;
  auVar6 = (undefined1  [8])QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
  if (auVar6 == (undefined1  [8])0x0) {
LAB_00186030:
    local_e8 = (char16_t *)((ulong)local_e8 & 0xffffffffffffff00);
  }
  else {
    QAbstractButton::shortcut();
    cVar4 = QKeySequence::isEmpty();
    if (cVar4 != '\0') {
      QKeySequence::~QKeySequence((QKeySequence *)&local_110);
      lVar7 = QToolButton::defaultAction();
      if (lVar7 != 0) {
        QAction::shortcut();
        cVar4 = QKeySequence::isEmpty();
        QKeySequence::~QKeySequence((QKeySequence *)local_128);
        if (cVar4 == '\0') {
          QAction::shortcut();
          local_128 = auVar6;
          QKeySequence::QKeySequence((QKeySequence *)&pcStack_120,(QKeySequence *)&local_110);
          local_f8 = local_128;
          QKeySequence::QKeySequence((QKeySequence *)auStack_f0,(QKeySequence *)&pcStack_120);
          goto LAB_001860e1;
        }
      }
      lVar7 = QToolButton::menu();
      if (lVar7 != 0) {
        QMenu::menuAction();
        QAction::shortcut();
        cVar4 = QKeySequence::isEmpty();
        QKeySequence::~QKeySequence((QKeySequence *)local_128);
        if (cVar4 == '\0') {
          QMenu::menuAction();
          QAction::shortcut();
          local_128 = auVar6;
          QKeySequence::QKeySequence((QKeySequence *)&pcStack_120,(QKeySequence *)&local_110);
          local_f8 = local_128;
          QKeySequence::QKeySequence((QKeySequence *)auStack_f0,(QKeySequence *)&pcStack_120);
          goto LAB_001860e1;
        }
      }
      goto LAB_00186030;
    }
    local_128 = auVar6;
    QKeySequence::QKeySequence((QKeySequence *)&pcStack_120,(QKeySequence *)&local_110);
    local_f8 = local_128;
    QKeySequence::QKeySequence((QKeySequence *)auStack_f0,(QKeySequence *)&pcStack_120);
LAB_001860e1:
    local_e8 = (char16_t *)CONCAT71(local_e8._1_7_,1);
    QKeySequence::~QKeySequence((QKeySequence *)&pcStack_120);
    QKeySequence::~QKeySequence((QKeySequence *)&local_110);
  }
  std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_move_assign
            ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_d0,
             (_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_f8);
  if (local_e8._0_1_ == true) {
    local_e8 = (char16_t *)((ulong)local_e8 & 0xffffffffffffff00);
    QKeySequence::~QKeySequence((QKeySequence *)auStack_f0);
  }
  if (local_c0 == false) {
    auVar6 = (undefined1  [8])QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
    if (auVar6 == (undefined1  [8])0x0) {
LAB_0018619e:
      local_e8 = (char16_t *)((ulong)local_e8 & 0xffffffffffffff00);
    }
    else {
      QAbstractButton::shortcut();
      cVar4 = QKeySequence::isEmpty();
      if (cVar4 != '\0') {
        QKeySequence::~QKeySequence((QKeySequence *)&local_110);
        lVar7 = QPushButton::menu();
        if (lVar7 != 0) {
          QMenu::menuAction();
          QAction::shortcut();
          cVar4 = QKeySequence::isEmpty();
          QKeySequence::~QKeySequence((QKeySequence *)local_128);
          if (cVar4 == '\0') {
            QMenu::menuAction();
            QAction::shortcut();
            local_128 = auVar6;
            QKeySequence::QKeySequence((QKeySequence *)&pcStack_120,(QKeySequence *)&local_110);
            local_f8 = local_128;
            QKeySequence::QKeySequence((QKeySequence *)auStack_f0,(QKeySequence *)&pcStack_120);
            goto LAB_00186215;
          }
        }
        goto LAB_0018619e;
      }
      local_128 = auVar6;
      QKeySequence::QKeySequence((QKeySequence *)&pcStack_120,(QKeySequence *)&local_110);
      local_f8 = local_128;
      QKeySequence::QKeySequence((QKeySequence *)auStack_f0,(QKeySequence *)&pcStack_120);
LAB_00186215:
      local_e8 = (char16_t *)CONCAT71(local_e8._1_7_,1);
      QKeySequence::~QKeySequence((QKeySequence *)&pcStack_120);
      QKeySequence::~QKeySequence((QKeySequence *)&local_110);
    }
    std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_move_assign
              ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_d0,
               (_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_f8);
    if (local_e8._0_1_ == true) {
      local_e8 = (char16_t *)((ulong)local_e8 & 0xffffffffffffff00);
      QKeySequence::~QKeySequence((QKeySequence *)auStack_f0);
    }
  }
  if (((local_c0 & 1U) == 0) &&
     (auVar6 = (undefined1  [8])QMetaObject::cast((QObject *)&QLabel::staticMetaObject),
     auVar6 != (undefined1  [8])0x0)) {
    QLabel::text();
    pcVar1 = local_e8;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
    if (pcVar1 != (char16_t *)0x0) {
      QLabel::text();
      QKeySequence::mnemonic((QString *)local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      cVar4 = QKeySequence::isEmpty();
      if (cVar4 == '\0') {
        local_f8 = auVar6;
        QKeySequence::QKeySequence((QKeySequence *)auStack_f0,(QKeySequence *)local_128);
        uVar2 = local_c8;
        local_d0 = local_f8;
        if (local_c0 == true) {
          local_c8 = auStack_f0;
          auStack_f0 = (undefined1  [8])uVar2;
        }
        else {
          QKeySequence::QKeySequence((QKeySequence *)&local_c8,(QKeySequence *)auStack_f0);
          local_c0 = true;
        }
        QKeySequence::~QKeySequence((QKeySequence *)auStack_f0);
      }
      QKeySequence::~QKeySequence((QKeySequence *)local_128);
    }
  }
  bVar3 = local_c0;
  if (local_c0 == true) {
    local_90.d = (Data *)0x0;
    local_90.ptr = L"%1 (%2)";
    local_90.size = 7;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QWidget::toolTip();
    QKeySequence::toString(&local_60,&local_c8,1);
    QString::arg<QString,QString>
              ((type *)&local_110,(QString *)&local_90,(QString *)&local_48,(QString *)&local_60);
    QString::trimmed_helper((QString *)local_128);
    auVar6 = local_d0;
    local_b0.size = local_118;
    local_b0.ptr = pcStack_120;
    local_b0.d = (Data *)local_128;
    local_f8 = local_d0;
    local_118 = 0;
    local_b8 = (QWidget *)local_d0;
    auStack_f0 = (undefined1  [8])0x0;
    local_128 = (undefined1  [8])0x0;
    pcStack_120 = (char16_t *)0x0;
    local_e8 = (char16_t *)0x0;
    qStack_e0 = 0;
    local_98 = '\x01';
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  else {
    local_98 = '\0';
  }
  if ((local_c0 & 1U) != 0) {
    local_c0 = false;
    QKeySequence::~QKeySequence((QKeySequence *)&local_c8);
  }
  if (bVar3 != false) {
    if (*(short *)(event + 8) == 0x6f) {
      QWhatsThis::showText((QPoint *)(event + 0x18),(QString *)&local_b0,(QWidget *)auVar6);
    }
    else if (*(short *)(event + 8) == 0x6e) {
      local_f8 = (undefined1  [8])0x0;
      auStack_f0 = (undefined1  [8])0xffffffffffffffff;
      QToolTip::showText((QPoint *)(event + 0x18),(QString *)&local_b0,(QWidget *)auVar6,
                         (QRect *)local_f8,-1);
    }
  }
  if (local_98 == '\x01') {
    local_98 = '\0';
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  }
  if (bVar3 != false) {
    return true;
  }
LAB_001864e9:
  uVar5 = QObject::eventFilter(&this->super_QObject,(QEvent *)object);
  return (bool)uVar5;
}

Assistant:

bool QKeySequenceRevealerFilter::eventFilter(QObject *object, QEvent *event) {
    switch (event->type()) {
    case QEvent::ToolTip:
    case QEvent::WhatsThis: {
        const auto widgetToolTip = [&]() -> std::optional<WidgetToolTip> {
            std::optional<WidgetSequence> ws;

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QToolButton *>(object));
            }

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QPushButton *>(object));
            }

            if (!ws) {
                if (auto label = qobject_cast<QLabel *>(object); label && !label->text().isEmpty()) {
                    const auto sequence = QKeySequence::mnemonic(label->text());

                    if (!sequence.isEmpty()) {
                        ws = {label, sequence};
                    }
                }
            }

            return ws
                ? WidgetToolTip {ws->first, QSL("%1 (%2)").arg(ws->first->toolTip(), ws->second.toString()).trimmed()}
                : std::optional<WidgetToolTip> {};
        }();

        if (widgetToolTip) {
            if (event->type() == QEvent::ToolTip) {
                const auto he = static_cast<QHelpEvent *>(event);
                QToolTip::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            } else if (event->type() == QEvent::WhatsThis) {
                const auto he = static_cast<QHelpEvent *>(event);
                QWhatsThis::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            }

            return true;
        }

        break;
    }
    default:
        break;
    }

    return QObject::eventFilter(object, event);
}